

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_sasl_response(AMQP_VALUE value,SASL_RESPONSE_HANDLE *sasl_response_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  SASL_RESPONSE_HANDLE pSVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  amqp_binary response;
  
  pSVar4 = (SASL_RESPONSE_HANDLE)malloc(8);
  if (pSVar4 == (SASL_RESPONSE_HANDLE)0x0) {
    *sasl_response_handle = (SASL_RESPONSE_HANDLE)0x0;
    iVar3 = 0x2c65;
  }
  else {
    pSVar4->composite_value = (AMQP_VALUE)0x0;
    *sasl_response_handle = pSVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      sasl_response_destroy(*sasl_response_handle);
      iVar3 = 0x2c6d;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&list_item_count);
      iVar3 = 0x2c74;
      if (iVar1 == 0) {
        if (list_item_count == 0) {
          iVar3 = 0x2ca1;
        }
        else {
          pAVar5 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar5 == (AMQP_VALUE)0x0) {
            sasl_response_destroy(*sasl_response_handle);
            iVar3 = 0x2c83;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar5);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar5);
              sasl_response_destroy(*sasl_response_handle);
              iVar3 = 0x2c8d;
            }
            else {
              iVar3 = amqpvalue_get_binary(pAVar5,&response);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar5);
                pAVar5 = amqpvalue_clone(value);
                pSVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(pAVar5);
                sasl_response_destroy(*sasl_response_handle);
                iVar3 = 0x2c97;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_sasl_response(AMQP_VALUE value, SASL_RESPONSE_HANDLE* sasl_response_handle)
{
    int result;
    SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)sasl_response_create_internal();
    *sasl_response_handle = sasl_response_instance;
    if (*sasl_response_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_response_destroy(*sasl_response_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* response */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_response_destroy(*sasl_response_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_response_destroy(*sasl_response_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                amqp_binary response;
                                if (amqpvalue_get_binary(item_value, &response) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_response_destroy(*sasl_response_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    sasl_response_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}